

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O1

_Bool compare_andnots(roaring_bitmap_t **rnorun,roaring_bitmap_t **rruns,size_t count)

{
  roaring_bitmap_t *x2;
  _Bool _Var1;
  roaring_bitmap_t *bitmap1;
  roaring_bitmap_t *prVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  _Bool _Var6;
  
  _Var6 = count < 2;
  if (!_Var6) {
    uVar4 = 2;
    do {
      bitmap1 = roaring_bitmap_andnot(rnorun[uVar4 - 2],rnorun[uVar4 - 1]);
      _Var1 = is_andnot_correct(rnorun[uVar4 - 2],rnorun[uVar4 - 1]);
      if (!_Var1) {
        puts("no-run andnot incorrect");
        return _Var6;
      }
      prVar2 = roaring_bitmap_andnot(rruns[uVar4 - 2],rruns[uVar4 - 1]);
      _Var1 = is_andnot_correct(rruns[uVar4 - 2],rruns[uVar4 - 1]);
      if (!_Var1) {
        pcVar5 = "runs andnots incorrect";
LAB_00103a06:
        puts(pcVar5);
        return _Var6;
      }
      _Var1 = slow_bitmap_equals(bitmap1,prVar2);
      if (!_Var1) {
        pcVar5 = "Andnots don\'t agree! (slow) ";
        goto LAB_00103a06;
      }
      _Var1 = roaring_bitmap_equals(bitmap1,prVar2);
      if (!_Var1) {
        pcVar5 = "Andnots don\'t agree!";
LAB_00103a14:
        puts(pcVar5);
        puts("\n\nbitmap1:");
        roaring_bitmap_printf_describe(bitmap1);
        puts("\n\nbitmap2:");
        roaring_bitmap_printf_describe(prVar2);
        return _Var6;
      }
      roaring_bitmap_free(bitmap1);
      roaring_bitmap_free(prVar2);
      prVar2 = rnorun[uVar4 - 1];
      bitmap1 = roaring_bitmap_copy(rnorun[uVar4 - 2]);
      roaring_bitmap_andnot_inplace(bitmap1,prVar2);
      _Var1 = is_andnot_correct(rnorun[uVar4 - 2],rnorun[uVar4 - 1]);
      if (!_Var1) {
        pcVar5 = "[inplace] no-run andnot incorrect";
        goto LAB_00103a06;
      }
      x2 = rruns[uVar4 - 1];
      prVar2 = roaring_bitmap_copy(rruns[uVar4 - 2]);
      roaring_bitmap_andnot_inplace(prVar2,x2);
      _Var1 = is_andnot_correct(rruns[uVar4 - 2],rruns[uVar4 - 1]);
      if (!_Var1) {
        pcVar5 = "[inplace] runs andnots incorrect";
        goto LAB_00103a06;
      }
      _Var1 = slow_bitmap_equals(bitmap1,prVar2);
      if (!_Var1) {
        pcVar5 = "[inplace] Andnots don\'t agree! (slow) ";
        goto LAB_00103a06;
      }
      _Var1 = roaring_bitmap_equals(bitmap1,prVar2);
      if (!_Var1) {
        pcVar5 = "[inplace] Andnots don\'t agree!";
        goto LAB_00103a14;
      }
      roaring_bitmap_free(bitmap1);
      roaring_bitmap_free(prVar2);
      _Var6 = count <= uVar4;
      lVar3 = (1 - count) + uVar4;
      uVar4 = uVar4 + 1;
    } while (lVar3 != 1);
  }
  return _Var6;
}

Assistant:

bool compare_andnots(roaring_bitmap_t **rnorun, roaring_bitmap_t **rruns,
                     size_t count) {
    roaring_bitmap_t *tempornorun;
    roaring_bitmap_t *temporruns;
    for (size_t i = 0; i + 1 < count; ++i) {
        tempornorun = roaring_bitmap_andnot(rnorun[i], rnorun[i + 1]);
        if (!is_andnot_correct(rnorun[i], rnorun[i + 1])) {
            printf("no-run andnot incorrect\n");
            return false;
        }
        temporruns = roaring_bitmap_andnot(rruns[i], rruns[i + 1]);
        if (!is_andnot_correct(rruns[i], rruns[i + 1])) {
            printf("runs andnots incorrect\n");
            return false;
        }
        if (!slow_bitmap_equals(tempornorun, temporruns)) {
            printf("Andnots don't agree! (slow) \n");
            return false;
        }

        if (!roaring_bitmap_equals(tempornorun, temporruns)) {
            printf("Andnots don't agree!\n");
            printf("\n\nbitmap1:\n");
            roaring_bitmap_printf_describe(tempornorun);  // debug
            printf("\n\nbitmap2:\n");
            roaring_bitmap_printf_describe(temporruns);  // debug
            return false;
        }
        roaring_bitmap_free(tempornorun);
        roaring_bitmap_free(temporruns);
        tempornorun = inplace_andnot(rnorun[i], rnorun[i + 1]);
        if (!is_andnot_correct(rnorun[i], rnorun[i + 1])) {
            printf("[inplace] no-run andnot incorrect\n");
            return false;
        }
        temporruns = inplace_andnot(rruns[i], rruns[i + 1]);
        if (!is_andnot_correct(rruns[i], rruns[i + 1])) {
            printf("[inplace] runs andnots incorrect\n");
            return false;
        }

        if (!slow_bitmap_equals(tempornorun, temporruns)) {
            printf("[inplace] Andnots don't agree! (slow) \n");
            return false;
        }

        if (!roaring_bitmap_equals(tempornorun, temporruns)) {
            printf("[inplace] Andnots don't agree!\n");
            printf("\n\nbitmap1:\n");
            roaring_bitmap_printf_describe(tempornorun);  // debug
            printf("\n\nbitmap2:\n");
            roaring_bitmap_printf_describe(temporruns);  // debug
            return false;
        }
        roaring_bitmap_free(tempornorun);
        roaring_bitmap_free(temporruns);
    }
    return true;
}